

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_resampler_internal.h
# Opt level: O0

void __thiscall
passthrough_resampler<short>::drop_audio_if_needed(passthrough_resampler<short> *this)

{
  uint32_t uVar1;
  uint uVar2;
  cubeb_log_level cVar3;
  size_t sVar4;
  cubeb_log_callback p_Var5;
  short *in_RDI;
  uint32_t available;
  uint32_t to_keep;
  short *length;
  auto_array<short> *this_00;
  
  uVar1 = min_buffered_audio_frame(*(uint32_t *)(in_RDI + 0x20));
  this_00 = (auto_array<short> *)(in_RDI + 4);
  sVar4 = auto_array<short>::length((auto_array<short> *)(in_RDI + 0x14));
  sVar4 = processor::samples_to_frames((processor *)this_00,sVar4);
  uVar2 = (uint)sVar4;
  if (uVar1 < uVar2) {
    cVar3 = cubeb_log_get_level();
    if (1 < (int)cVar3) {
      p_Var5 = cubeb_log_get_callback();
      if (p_Var5 != (cubeb_log_callback)0x0) {
        cubeb_async_log("Dropping %u frames",(ulong)(uVar2 - uVar1));
      }
    }
    length = in_RDI + 0x14;
    processor::frames_to_samples((processor *)(in_RDI + 4),(ulong)(uVar2 - uVar1));
    auto_array<short>::pop(this_00,in_RDI,(size_t)length);
  }
  return;
}

Assistant:

void drop_audio_if_needed()
  {
    uint32_t to_keep = min_buffered_audio_frame(sample_rate);
    uint32_t available = samples_to_frames(internal_input_buffer.length());
    if (available > to_keep) {
      ALOGV("Dropping %u frames", available - to_keep);
      internal_input_buffer.pop(nullptr,
                                frames_to_samples(available - to_keep));
    }
  }